

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float *in_RCX;
  float *in_RDX;
  undefined8 *in_R8;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  ImVec2 *unaff_retaddr;
  ImVec2 size_constrained;
  ImVec2 size_expected;
  ImVec2 pos_max;
  ImVec2 pos_min;
  ImVec2 *in_stack_ffffffffffffffa8;
  ImVec2 *in_stack_ffffffffffffffb0;
  ImVec2 *in_stack_ffffffffffffffb8;
  undefined8 uVar8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  auVar3._0_8_ = ImLerp(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
  auVar3._8_56_ = extraout_var;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  auVar4._0_8_ = operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x1d45a0);
  auVar4._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar4._0_16_);
  auVar5._0_8_ = ImLerp(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
  auVar5._8_56_ = extraout_var_01;
  vmovlpd_avx(auVar5._0_16_);
  auVar6._0_8_ = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x1d45cf);
  auVar6._8_56_ = extraout_var_02;
  uVar8 = vmovlpd_avx(auVar6._0_16_);
  auVar7._0_8_ = CalcWindowSizeAfterConstraint((ImGuiWindow *)size_constrained,unaff_retaddr);
  auVar7._8_56_ = extraout_var_03;
  uVar2 = vmovlpd_avx(auVar7._0_16_);
  *(undefined8 *)in_RCX = uVar1;
  if ((*in_RDX == 0.0) && (!NAN(*in_RDX))) {
    *in_RCX = *in_RCX - ((float)uVar2 - (float)uVar8);
  }
  if ((in_RDX[1] == 0.0) && (!NAN(in_RDX[1]))) {
    in_RCX[1] = in_RCX[1] - ((float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar8 >> 0x20));
  }
  *in_R8 = uVar2;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}